

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node48.cpp
# Opt level: O2

Node48 * duckdb::Node48::ShrinkNode256(ART *art,Node *node48,Node *node256)

{
  Node48 *pNVar1;
  Node256 *pNVar2;
  long lVar3;
  uint8_t i;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  pNVar1 = New(art,node48);
  pNVar2 = Node::Ref<duckdb::Node256>(art,(Node)(node256->super_IndexPointer).data,NODE_256);
  Node::SetGateStatus(node48,(GateStatus)((node256->super_IndexPointer).data >> 0x3f));
  pNVar1->count = '\0';
  uVar6 = 0;
  for (lVar3 = 1; uVar4 = uVar6 & 0xff, lVar3 != 0x101; lVar3 = lVar3 + 1) {
    if (*(char *)((long)&pNVar2->children[lVar3 + -1].super_IndexPointer.data + 7) == '\0') {
      pNVar1->child_index[lVar3 + -1] = '0';
    }
    else {
      pNVar1->child_index[lVar3 + -1] = (uint8_t)uVar6;
      pNVar1->children[uVar4].super_IndexPointer.data =
           pNVar2->children[lVar3 + -1].super_IndexPointer.data;
      uVar5 = (int)uVar4 + 1;
      uVar6 = (ulong)uVar5;
      pNVar1->count = (uint8_t)uVar5;
    }
  }
  for (; uVar4 < 0x30; uVar4 = uVar4 + 1) {
    pNVar1->children[uVar4].super_IndexPointer.data = 0;
  }
  pNVar2->count = 0;
  Node::Free(art,node256);
  return pNVar1;
}

Assistant:

Node48 &Node48::ShrinkNode256(ART &art, Node &node48, Node &node256) {
	auto &n48 = New(art, node48);
	auto &n256 = Node::Ref<Node256>(art, node256, NType::NODE_256);
	node48.SetGateStatus(node256.GetGateStatus());

	n48.count = 0;
	for (uint16_t i = 0; i < Node256::CAPACITY; i++) {
		if (!n256.children[i].HasMetadata()) {
			n48.child_index[i] = EMPTY_MARKER;
			continue;
		}
		n48.child_index[i] = n48.count;
		n48.children[n48.count] = n256.children[i];
		n48.count++;
	}
	for (uint8_t i = n48.count; i < CAPACITY; i++) {
		n48.children[i].Clear();
	}

	n256.count = 0;
	Node::Free(art, node256);
	return n48;
}